

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall Importer_library_Test::~Importer_library_Test(Importer_library_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, library)
{
    auto importer = libcellml::Importer::create();
    auto model1 = libcellml::Model::create("model1");
    auto model2 = libcellml::Model::create("model2");
    auto model3 = libcellml::Model::create("model3");
    auto model4 = libcellml::Model::create("model4");

    EXPECT_TRUE(importer->addModel(model1, "a_model_the_first.cellml"));
    EXPECT_TRUE(importer->addModel(model2, "b_tweede_voorbeeld.cellml"));
    EXPECT_TRUE(importer->addModel(model3, "c_troisieme_modele.cellml"));

    // Add another under the first key, expect false.
    EXPECT_FALSE(importer->addModel(model4, "a_model_the_first.cellml"));
    EXPECT_EQ(size_t(3), importer->libraryCount());

    // Access library by key.
    EXPECT_EQ(model1, importer->library("a_model_the_first.cellml"));
    EXPECT_EQ(model2, importer->library("b_tweede_voorbeeld.cellml"));
    EXPECT_EQ(model3, importer->library("c_troisieme_modele.cellml"));
    EXPECT_EQ(nullptr, importer->library("d_tuawha.cellml"));

    // Access library by index.
    EXPECT_EQ(model1, importer->library(0));
    EXPECT_EQ(model2, importer->library(1));
    EXPECT_EQ(model3, importer->library(2));
    EXPECT_EQ(nullptr, importer->library(999));
}